

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

AtomicSort * Kernel::AtomicSort::create(uint typeCon,uint arity,TermList *args)

{
  int *piVar1;
  uint *puVar2;
  Cell *pCVar3;
  uint64_t *puVar4;
  TermSharing *pTVar5;
  bool bVar6;
  type tVar7;
  uint uVar8;
  AtomicSort *pAVar9;
  Cell *pCVar10;
  TermList *pTVar11;
  Cell *pCVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint arity_local;
  uint typeCon_local;
  TermList *args_local;
  anon_class_24_3_776da329 allocTerm;
  anon_class_24_3_776da329 local_48;
  
  lVar14 = 0;
  arity_local = arity;
  typeCon_local = typeCon;
  args_local = args;
  do {
    pTVar5 = DAT_00a14198;
    if (arity <= (uint)lVar14) {
      allocTerm.arity = &arity_local;
      allocTerm.typeCon = &typeCon_local;
      allocTerm.args = &args_local;
      tVar7 = Lib::DefaultHash::hash<unsigned_int>(typeCon,0x811c9dc5);
      for (uVar15 = 0; arity != uVar15; uVar15 = uVar15 + 1) {
        local_48.arity = (uint *)args_local[uVar15]._content;
        uVar8 = Lib::DefaultHash::hashBytes((uchar *)&local_48,8,0x811c9dc5);
        tVar7 = (uVar8 ^ tVar7) * 0x1000193;
      }
      local_48.args = allocTerm.args;
      uVar15 = 2;
      if (2 < tVar7) {
        uVar15 = (ulong)tVar7;
      }
      local_48.arity = allocTerm.arity;
      local_48.typeCon = allocTerm.typeCon;
      if ((pTVar5->_sorts)._maxEntries <= (pTVar5->_sorts)._nonemptyCells) {
        Lib::Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::expand(&pTVar5->_sorts);
      }
      pCVar3 = (pTVar5->_sorts)._entries;
      pCVar12 = (Cell *)0x0;
      pCVar10 = pCVar3 + uVar15 % (ulong)(uint)(pTVar5->_sorts)._capacity;
      do {
        uVar8 = pCVar10->code;
        if (uVar8 == 0) {
          if (pCVar12 == (Cell *)0x0) {
            piVar1 = &(pTVar5->_sorts)._nonemptyCells;
            *piVar1 = *piVar1 + 1;
            pCVar12 = pCVar10;
          }
          puVar2 = &(pTVar5->_sorts)._size;
          *puVar2 = *puVar2 + 1;
          pAVar9 = create::anon_class_24_3_776da329::operator()(&local_48);
          pCVar12->value = pAVar9;
          pCVar12->code = (uint)uVar15;
          pAVar9 = pCVar12->value;
          Indexing::TermSharing::computeAndSetSharedSortData(DAT_00a14198,pAVar9);
          return pAVar9;
        }
        if (uVar8 == 1) {
          if (pCVar12 == (Cell *)0x0) {
            pCVar12 = pCVar10;
          }
        }
        else if ((uVar8 == (uint)uVar15) &&
                (pAVar9 = pCVar10->value, (pAVar9->super_Term)._functor == typeCon_local)) {
          lVar14 = 0;
          pTVar11 = args_local;
          do {
            if (-lVar14 == (ulong)arity_local) {
              return pCVar10->value;
            }
            iVar13 = (int)lVar14;
            puVar4 = &pTVar11->_content;
            lVar14 = lVar14 + -1;
            pTVar11 = pTVar11 + 1;
          } while (*puVar4 ==
                   (pAVar9->super_Term)._args
                   [(int)((*(uint *)&(pAVar9->super_Term).field_0xc & 0xfffffff) + iVar13)]._content
                  );
        }
        pCVar10 = pCVar10 + 1;
        if (pCVar10 == (pTVar5->_sorts)._afterLast) {
          pCVar10 = pCVar3;
        }
      } while( true );
    }
    pTVar11 = args + lVar14;
    lVar14 = lVar14 + 1;
    bVar6 = argSafeToShare((TermList)pTVar11->_content);
  } while (bVar6);
  allocTerm.arity = &arity_local;
  allocTerm.typeCon = &typeCon_local;
  allocTerm.args = &args_local;
  pAVar9 = create::anon_class_24_3_776da329::operator()(&allocTerm);
  return pAVar9;
}

Assistant:

AtomicSort* AtomicSort::create(unsigned typeCon, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->typeConArity(typeCon), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    AtomicSort* s = new(arity) AtomicSort(typeCon,arity);
    s->makeSymbol(typeCon,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_sorts.rawFindOrInsert(allocTerm,
        Term::termHash(typeCon, [&](auto i){ return args[i]; }, arity),
        [&](AtomicSort* t) { return t->functor() == typeCon && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created
        );
    if (created) {
      env.sharing->computeAndSetSharedSortData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}